

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O3

void __thiscall
CryptoUtil_EncryptAes256String32_Test::~CryptoUtil_EncryptAes256String32_Test
          (CryptoUtil_EncryptAes256String32_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256String32) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData byte_data = CryptoUtil::EncryptAes256(
      key.GetBytes(), "aiueoaiueoaiueoaiueoaiueoaiueoai");
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "6af0d7adef48de1e90dde0423d4b1ecc72b60ec0a33c716c397bc50f9662b581");
}